

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

string * __thiscall
clipp::usage_lines::joined_label_abi_cxx11_
          (string *__return_storage_ptr__,usage_lines *this,group *g,context *cur)

{
  pointer pcVar1;
  bool bVar2;
  byte bVar3;
  child_t<clipp::parameter,_clipp::group> *p;
  pointer pcVar4;
  child_t<clipp::parameter,_clipp::group> *p_1;
  size_type n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  arg_string pfx;
  
  if ((((this->fmt_).mergeAltCommonPfx_ != false) || ((this->fmt_).mergeJoinableCommonPfx_ != false)
      ) && (bVar2 = std::
                    all_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_1_>
                              ((g->children_).
                               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (g->children_).
                               super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish), bVar2)) {
    bVar2 = group::all_optional(g);
    if (bVar2) {
      bVar3 = this->ommitOutermostSurrounders_ ^ 1U | cur->outermost != g;
    }
    else {
      bVar3 = 0;
    }
    group::common_flag_prefix_abi_cxx11_(&pfx,g);
    if (pfx._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_78);
    }
    else {
      n = pfx._M_string_length;
      if ((g->exclusive_ == true) && ((this->fmt_).mergeAltCommonPfx_ == true)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (bVar3 != 0) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::operator+(&local_78,&pfx,&(this->fmt_).alternPre_);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_78);
        pcVar1 = (g->children_).
                 super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_58 = &(this->fmt_).altParamSep_;
        bVar2 = true;
        for (pcVar4 = (g->children_).
                      super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pcVar4 != pcVar1;
            pcVar4 = pcVar4 + 1) {
          if (pcVar4->type_ == param) {
            if (!bVar2) {
              std::__cxx11::string::append((string *)__return_storage_ptr__);
            }
            std::__cxx11::string::substr
                      ((ulong)&local_78,
                       (ulong)(pcVar4->m_).param.flags_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_78);
            bVar2 = false;
          }
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        if (bVar3 != 0) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else if ((g->joinable_ == true) &&
              (((this->fmt_).mergeJoinableCommonPfx_ == true &&
               (bVar2 = std::
                        all_of<__gnu_cxx::__normal_iterator<clipp::group::child_t<clipp::parameter,clipp::group>const*,std::vector<clipp::group::child_t<clipp::parameter,clipp::group>,std::allocator<clipp::group::child_t<clipp::parameter,clipp::group>>>>,clipp::usage_lines::joined_label[abi:cxx11](clipp::group_const&,clipp::usage_lines::context_const&)const::_lambda(clipp::group::child_t<clipp::parameter,clipp::group>const&)_2_>
                                  ((g->children_).
                                   super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (g->children_).
                                   super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (anon_class_8_1_54a3980e)&n), bVar2)))) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        if (bVar3 != 0) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        pcVar1 = (g->children_).
                 super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pcVar4 = (g->children_).
                      super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pcVar4 != pcVar1;
            pcVar4 = pcVar4 + 1) {
          if (pcVar4->type_ == param) {
            std::__cxx11::string::substr
                      ((ulong)&local_78,
                       (ulong)(pcVar4->m_).param.flags_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_78);
          }
        }
        if (bVar3 != 0) {
          std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_78);
      }
    }
    std::__cxx11::string::~string((string *)&pfx);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&pfx);
  return __return_storage_ptr__;
}

Assistant:

string joined_label(const group& g, const context& cur) const
    {
        if(!fmt_.merge_alternative_flags_with_common_prefix() &&
           !fmt_.merge_joinable_with_common_prefix()) return "";

        const bool flagsonly = std::all_of(g.begin(), g.end(),
            [](const pattern& p){
                return p.is_param() && !p.as_param().flags().empty();
            });

        if(!flagsonly) return "";

        const bool showOpt = g.all_optional() &&
            !(ommitOutermostSurrounders_ && cur.outermost == &g);

        auto pfx = g.common_flag_prefix();
        if(pfx.empty()) return "";

        const auto n = pfx.size();
        if(g.exclusive() &&
           fmt_.merge_alternative_flags_with_common_prefix())
        {
            string lbl;
            if(showOpt) lbl += fmt_.optional_prefix();
            lbl += pfx + fmt_.alternatives_prefix();
            bool first = true;
            for(const auto& p : g) {
                if(p.is_param()) {
                    if(first)
                        first = false;
                    else
                        lbl += fmt_.alternative_param_separator();
                    lbl += p.as_param().flags().front().substr(n);
                }
            }
            lbl += fmt_.alternatives_postfix();
            if(showOpt) lbl += fmt_.optional_postfix();
            return lbl;
        }
        //no alternatives, but joinable flags
        else if(g.joinable() &&
            fmt_.merge_joinable_with_common_prefix())
        {
            const bool allSingleChar = std::all_of(g.begin(), g.end(),
                [&](const pattern& p){
                    return p.is_param() &&
                        p.as_param().flags().front().substr(n).size() == 1;
                });

            if(allSingleChar) {
                string lbl;
                if(showOpt) lbl += fmt_.optional_prefix();
                lbl += pfx;
                for(const auto& p : g) {
                    if(p.is_param())
                        lbl += p.as_param().flags().front().substr(n);
                }
                if(showOpt) lbl += fmt_.optional_postfix();
                return lbl;
            }
        }

        return "";
    }